

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall
llvm::raw_fd_ostream::changeColor(raw_fd_ostream *this,Colors colors,bool bold,bool bg)

{
  bool bVar1;
  char *__s;
  void *__buf;
  undefined3 in_register_00000009;
  undefined4 uVar2;
  undefined4 in_register_0000000c;
  
  uVar2 = CONCAT31(in_register_00000009,bg);
  bVar1 = sys::Process::ColorNeedsFlush();
  if ((bVar1) && (*(long *)&this->field_0x18 != *(long *)&this->field_0x8)) {
    raw_ostream::flush_nonempty((raw_ostream *)this);
  }
  if (colors == SAVEDCOLOR) {
    __s = sys::Process::OutputBold(bg);
  }
  else {
    __s = sys::Process::OutputColor((char)colors,bold,bg);
  }
  if (__s != (char *)0x0) {
    __buf = (void *)strlen(__s);
    raw_ostream::write((raw_ostream *)this,(int)__s,__buf,CONCAT44(in_register_0000000c,uVar2));
    this->pos = this->pos - (long)__buf;
  }
  return (raw_ostream *)this;
}

Assistant:

raw_ostream &raw_fd_ostream::changeColor(enum Colors colors, bool bold,
                                         bool bg) {
  if (sys::Process::ColorNeedsFlush())
    flush();
  const char *colorcode =
    (colors == SAVEDCOLOR) ? sys::Process::OutputBold(bg)
    : sys::Process::OutputColor(colors, bold, bg);
  if (colorcode) {
    size_t len = strlen(colorcode);
    write(colorcode, len);
    // don't account colors towards output characters
    pos -= len;
  }
  return *this;
}